

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void compute_stats_win7_opt_sse4_1
               (uint8_t *dgd,uint8_t *src,int h_start,int h_end,int v_start,int v_end,int dgd_stride
               ,int src_stride,int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000018;
  long in_stack_00000020;
  int64_t *H_int_;
  int64_t *H_;
  int32_t idx0;
  int64_t avg_square_sum;
  int vert_end;
  __m128i shuffle;
  int32_t sumY_row [7] [7];
  int32_t sumX_row;
  int downsample_factor;
  uint8_t *dgd_win;
  int32_t sumX;
  int32_t sumY [7] [7];
  int64_t H_int64 [49] [56];
  int32_t H_int32_row [49] [56];
  int32_t H_int32 [49] [56];
  int64_t M_int64 [7] [7];
  int32_t M_int32_row [7] [7];
  int32_t M_int32 [7] [7];
  uint8_t avg;
  int wiener_halfwin;
  int wiener_win2;
  int pixel_count;
  int wiener_win;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int local_b0e4;
  int local_b0a8 [16];
  __m128i *in_stack_ffffffffffff4f98;
  int in_stack_ffffffffffff4fa4;
  int in_stack_ffffffffffff4fa8;
  int in_stack_ffffffffffff4fac;
  uint8_t *in_stack_ffffffffffff4fb0;
  uint8_t *in_stack_ffffffffffff4fb8;
  int local_afdc;
  int local_afc8 [2];
  int32_t *in_stack_ffffffffffff5040;
  int32_t (*in_stack_ffffffffffff5048) [7];
  int32_t (*in_stack_ffffffffffff5050) [7];
  int32_t (*in_stack_ffffffffffff5058) [56];
  long local_aef8 [2744];
  int local_5938 [2744];
  int local_2e58 [2744];
  long local_378 [50];
  int local_1e8 [52];
  int local_118 [49];
  byte local_51;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_44 = 7;
  local_48 = (in_ECX - in_EDX) * (in_R9D - in_R8D);
  local_4c = 0x31;
  local_50 = 3;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_51 = find_average(in_RDI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  memset(local_118,0,0xc4);
  memset(local_1e8,0,0xc4);
  memset(local_378,0,0x188);
  memset(local_2e58,0,0x2ae0);
  memset(local_5938,0,0x2ae0);
  memset(local_aef8,0,0x55c0);
  memset(local_afc8,0,0xc4);
  local_afdc = 1;
  if ((int)H_int_ != 0) {
    local_afdc = 4;
  }
  memset(local_b0a8,0,0xc4);
  xx_loadu_128("");
  for (local_30 = local_24; local_30 < local_28; local_30 = local_30 + 0x40) {
    if (local_28 - local_30 < 0x41) {
      local_b0e4 = local_28 - local_30;
    }
    else {
      local_b0e4 = 0x40;
    }
    local_b0e4 = local_b0e4 + local_30;
    for (local_2c = local_30; local_2c < local_b0e4; local_2c = local_2c + local_afdc) {
      if (((int)H_int_ != 0) && (local_b0e4 - local_2c < 4)) {
        local_afdc = local_b0e4 - local_2c;
      }
      memset(local_b0a8,0,0xc4);
      memset(local_1e8,0,0xc4);
      memset(local_5938,0,0x2ae0);
      acc_stat_win7_one_line_sse4_1
                (in_stack_ffffffffffff4fb8,in_stack_ffffffffffff4fb0,in_stack_ffffffffffff4fac,
                 in_stack_ffffffffffff4fa8,in_stack_ffffffffffff4fa4,in_stack_ffffffffffff4f98,
                 in_stack_ffffffffffff5040,in_stack_ffffffffffff5048,in_stack_ffffffffffff5050,
                 in_stack_ffffffffffff5058);
      for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
          local_afc8[(long)local_34 * 7 + (long)local_38] =
               local_b0a8[(long)local_34 * 7 + (long)local_38] * local_afdc +
               local_afc8[(long)local_34 * 7 + (long)local_38];
          local_118[(long)local_34 * 7 + (long)local_38] =
               local_1e8[(long)local_34 * 7 + (long)local_38] * local_afdc +
               local_118[(long)local_34 * 7 + (long)local_38];
        }
      }
      for (local_34 = 0; local_34 < 0x31; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < 0x38; local_38 = local_38 + 1) {
          local_2e58[(long)local_34 * 0x38 + (long)local_38] =
               local_5938[(long)local_34 * 0x38 + (long)local_38] * local_afdc +
               local_2e58[(long)local_34 * 0x38 + (long)local_38];
        }
      }
    }
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
        local_378[(long)local_34 * 7 + (long)local_38] =
             (long)local_118[(long)local_34 * 7 + (long)local_38] +
             local_378[(long)local_34 * 7 + (long)local_38];
        local_118[(long)local_34 * 7 + (long)local_38] = 0;
      }
    }
    for (local_34 = 0; local_34 < 0x31; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 0x38; local_38 = local_38 + 1) {
        local_aef8[(long)local_34 * 0x38 + (long)local_38] =
             (long)local_2e58[(long)local_34 * 0x38 + (long)local_38] +
             local_aef8[(long)local_34 * 0x38 + (long)local_38];
        local_2e58[(long)local_34 * 0x38 + (long)local_38] = 0;
      }
    }
  }
  lVar2 = (ulong)local_51 * (ulong)local_51 * (long)local_48;
  for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
      iVar1 = local_38 * 7 + local_34;
      *(ulong *)(in_stack_00000018 + (long)iVar1 * 8) =
           local_378[(long)local_34 * 7 + (long)local_38] +
           (lVar2 - (ulong)local_51 * (long)local_afc8[(long)local_34 * 7 + (long)local_38]);
      for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
          *(ulong *)(in_stack_00000020 + (long)(iVar1 * 0x31) * 8 +
                    (long)(local_3c * 7 + local_40) * 8) =
               (local_aef8[(long)iVar1 * 0x38 + (long)(local_40 * 8 + local_3c)] + lVar2) -
               (ulong)local_51 *
               (long)(local_afc8[(long)local_34 * 7 + (long)local_38] +
                     local_afc8[(long)local_40 * 7 + (long)local_3c]);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void compute_stats_win7_opt_sse4_1(
    const uint8_t *dgd, const uint8_t *src, int h_start, int h_end, int v_start,
    int v_end, int dgd_stride, int src_stride, int64_t *M, int64_t *H,
    int use_downsampled_wiener_stats) {
  int i, j, k, l, m, n;
  const int wiener_win = WIENER_WIN;
  const int pixel_count = (h_end - h_start) * (v_end - v_start);
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint8_t avg =
      find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  int32_t M_int32[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int32_t M_int32_row[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int64_t M_int64[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int32_t H_int32[WIENER_WIN2][WIENER_WIN * 8] = { { 0 } };
  int32_t H_int32_row[WIENER_WIN2][WIENER_WIN * 8] = { { 0 } };
  int64_t H_int64[WIENER_WIN2][WIENER_WIN * 8] = { { 0 } };
  int32_t sumY[WIENER_WIN][WIENER_WIN] = { { 0 } };
  int32_t sumX = 0;
  const uint8_t *dgd_win = dgd - wiener_halfwin * dgd_stride - wiener_halfwin;
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
  int32_t sumX_row = 0;
  int32_t sumY_row[WIENER_WIN][WIENER_WIN] = { { 0 } };

  const __m128i shuffle = xx_loadu_128(g_shuffle_stats_data);
  for (j = v_start; j < v_end; j += 64) {
    const int vert_end = AOMMIN(64, v_end - j) + j;
    for (i = j; i < vert_end; i = i + downsample_factor) {
      if (use_downsampled_wiener_stats &&
          (vert_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
        downsample_factor = vert_end - i;
      }
      sumX_row = 0;
      memset(sumY_row, 0, sizeof(int32_t) * WIENER_WIN * WIENER_WIN);
      memset(M_int32_row, 0, sizeof(int32_t) * WIENER_WIN * WIENER_WIN);
      memset(H_int32_row, 0, sizeof(int32_t) * WIENER_WIN2 * (WIENER_WIN * 8));
      acc_stat_win7_one_line_sse4_1(
          dgd_win + i * dgd_stride, src + i * src_stride, h_start, h_end,
          dgd_stride, &shuffle, &sumX_row, sumY_row, M_int32_row, H_int32_row);
      sumX += sumX_row * downsample_factor;
      // Scale M matrix based on the downsampling factor
      for (k = 0; k < wiener_win; ++k) {
        for (l = 0; l < wiener_win; ++l) {
          sumY[k][l] += (sumY_row[k][l] * downsample_factor);
          M_int32[k][l] += (M_int32_row[k][l] * downsample_factor);
        }
      }
      // Scale H matrix based on the downsampling factor
      for (k = 0; k < WIENER_WIN2; ++k) {
        for (l = 0; l < WIENER_WIN * 8; ++l) {
          H_int32[k][l] += (H_int32_row[k][l] * downsample_factor);
        }
      }
    }
    for (k = 0; k < wiener_win; ++k) {
      for (l = 0; l < wiener_win; ++l) {
        M_int64[k][l] += M_int32[k][l];
        M_int32[k][l] = 0;
      }
    }
    for (k = 0; k < WIENER_WIN2; ++k) {
      for (l = 0; l < WIENER_WIN * 8; ++l) {
        H_int64[k][l] += H_int32[k][l];
        H_int32[k][l] = 0;
      }
    }
  }

  const int64_t avg_square_sum = (int64_t)avg * (int64_t)avg * pixel_count;
  for (k = 0; k < wiener_win; k++) {
    for (l = 0; l < wiener_win; l++) {
      const int32_t idx0 = l * wiener_win + k;
      M[idx0] =
          M_int64[k][l] + (avg_square_sum - (int64_t)avg * (sumX + sumY[k][l]));
      int64_t *H_ = H + idx0 * wiener_win2;
      int64_t *H_int_ = &H_int64[idx0][0];
      for (m = 0; m < wiener_win; m++) {
        for (n = 0; n < wiener_win; n++) {
          H_[m * wiener_win + n] = H_int_[n * 8 + m] + avg_square_sum -
                                   (int64_t)avg * (sumY[k][l] + sumY[n][m]);
        }
      }
    }
  }
}